

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

uint ON_MeshNgon::IsValid
               (ON_MeshNgon *ngon,uint ngon_index,ON_TextLog *text_logx,uint mesh_vertex_count,
               uint mesh_face_count,ON_MeshFace *mesh_F,
               ON_SimpleArray<unsigned_int> *workspace_buffer)

{
  int iVar1;
  uint *puVar2;
  bool bVar3;
  ulong uVar4;
  uint *puVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  char *pcVar9;
  ulong uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  ON_TextLog *this;
  uint uVar14;
  ON_MeshFace *this_00;
  
  iVar1 = workspace_buffer->m_capacity;
  if (-1 < (long)iVar1) {
    workspace_buffer->m_count = 0;
  }
  if (ngon == (ON_MeshNgon *)0x0) {
    return 1;
  }
  this = (ON_TextLog *)((ulong)text_logx & 0xfffffffffffffffe);
  uVar8 = ngon->m_Vcount;
  uVar7 = (ulong)uVar8;
  if (uVar7 < 3) {
    if (this == (ON_TextLog *)0x0) goto joined_r0x004f8332;
    pcVar9 = "ON_Mesh.Ngon(%u)->m_Vcount < 3.\n";
  }
  else {
    uVar14 = ngon->m_Fcount;
    if ((ulong)uVar14 != 0) {
      puVar2 = ngon->m_vi;
      if (puVar2 == (uint *)0x0) {
        if (this == (ON_TextLog *)0x0) goto joined_r0x004f8332;
        pcVar9 = "ON_Mesh.Ngon(%u)->m_vi is nullptr.\n";
      }
      else {
        puVar5 = ngon->m_fi;
        if (puVar5 == (uint *)0x0) {
          if (this == (ON_TextLog *)0x0) goto joined_r0x004f8332;
          pcVar9 = "ON_Mesh.Ngon(%u)->m_fi is nullptr.\n";
        }
        else {
          uVar4 = 0;
          do {
            if (mesh_vertex_count <= puVar2[uVar4]) {
              if (this == (ON_TextLog *)0x0) goto joined_r0x004f8332;
              pcVar9 = "ON_Mesh.Ngon(%u)->m_vi[%u] is invalid.\n";
              goto LAB_004f8326;
            }
            uVar4 = uVar4 + 1;
          } while (uVar7 != uVar4);
          uVar4 = 0;
          do {
            if (mesh_face_count <= puVar5[uVar4]) {
              if (this == (ON_TextLog *)0x0) goto joined_r0x004f8332;
              pcVar9 = "ON_Mesh.Ngon(%u)->m_fi[%u] is invalid.\n";
              goto LAB_004f8326;
            }
            uVar4 = uVar4 + 1;
          } while (uVar14 != uVar4);
          if (mesh_F == (ON_MeshFace *)0x0) {
            return 1;
          }
          if (uVar8 - 3 < 2 && uVar14 == 1) {
            this_00 = mesh_F + *puVar5;
            bVar3 = ON_MeshFace::IsValid(this_00,mesh_vertex_count);
            if (!bVar3) {
              if (this == (ON_TextLog *)0x0) goto joined_r0x004f8332;
              pcVar9 = "ON_Mesh.Ngon(%u)->m_fi[0] is invalid.\n";
              goto LAB_004f82fb;
            }
            uVar4 = 0;
            do {
              if (this_00->vi[0] == puVar2[uVar4]) {
                uVar10 = 0;
                if (uVar4 + 1 != uVar7) {
                  uVar10 = uVar4 + 1 & 0xffffffff;
                }
                if (this_00->vi[1] == puVar2[uVar10]) {
                  if (this_00->vi[2] == puVar2[(ulong)((int)uVar4 + 2) % uVar7]) {
                    if (uVar7 == 4) {
                      if (this_00->vi[3] == puVar2[(int)uVar4 - 1U & 3]) {
                        return uVar8;
                      }
                    }
                    else if ((uVar8 == 3) && (this_00->vi[3] == this_00->vi[2])) {
                      return 3;
                    }
                  }
                }
              }
              uVar4 = uVar4 + 1;
            } while (uVar4 != uVar7);
          }
          if ((ulong)(long)iVar1 < (ulong)(uVar14 * 8)) {
            ON_SimpleArray<unsigned_int>::SetCapacity(workspace_buffer,(ulong)(uVar14 * 8));
            uVar14 = ngon->m_Fcount;
          }
          puVar2 = workspace_buffer->m_a;
          if (uVar14 == 0) {
            uVar8 = 0;
          }
          else {
            puVar5 = ngon->m_fi;
            uVar7 = 0;
            uVar8 = 0;
            do {
              uVar6 = puVar5[uVar7];
              uVar12 = mesh_F[uVar6].vi[0];
              uVar11 = mesh_F[uVar6].vi[3];
              uVar13 = uVar12;
              if ((uVar11 < uVar12) ||
                 (bVar3 = uVar12 < uVar11, uVar13 = uVar11, uVar11 = uVar12, bVar3)) {
                uVar4 = (ulong)uVar8;
                puVar2[uVar4 * 2] = uVar11;
                uVar8 = uVar8 + 1;
                puVar2[uVar4 * 2 + 1] = uVar13;
              }
              uVar11 = mesh_F[uVar6].vi[1];
              uVar13 = uVar11;
              if ((uVar12 < uVar11) ||
                 (bVar3 = uVar11 < uVar12, uVar13 = uVar12, uVar12 = uVar11, bVar3)) {
                uVar4 = (ulong)uVar8;
                puVar2[uVar4 * 2] = uVar12;
                uVar8 = uVar8 + 1;
                puVar2[uVar4 * 2 + 1] = uVar13;
              }
              uVar12 = mesh_F[uVar6].vi[2];
              uVar13 = uVar12;
              if ((uVar11 < uVar12) ||
                 (bVar3 = uVar12 < uVar11, uVar13 = uVar11, uVar11 = uVar12, bVar3)) {
                uVar4 = (ulong)uVar8;
                puVar2[uVar4 * 2] = uVar11;
                uVar8 = uVar8 + 1;
                puVar2[uVar4 * 2 + 1] = uVar13;
              }
              uVar6 = mesh_F[uVar6].vi[3];
              uVar11 = uVar6;
              if ((uVar12 < uVar6) ||
                 (bVar3 = uVar6 < uVar12, uVar11 = uVar12, uVar12 = uVar6, bVar3)) {
                uVar4 = (ulong)uVar8;
                puVar2[uVar4 * 2] = uVar12;
                uVar8 = uVar8 + 1;
                puVar2[uVar4 * 2 + 1] = uVar11;
              }
              uVar7 = uVar7 + 1;
            } while (uVar14 != uVar7);
          }
          if (uVar8 < ngon->m_Vcount) {
            if (this == (ON_TextLog *)0x0) goto joined_r0x004f8332;
            pcVar9 = "ON_Mesh.Ngon(%u) has invalid face or vertex list.\n";
          }
          else {
            ON_qsort(puVar2,(ulong)uVar8,8,compare2u);
            if (uVar8 == 0) {
              uVar14 = 0;
            }
            else {
              uVar7 = 0;
              uVar6 = 0;
              do {
                uVar14 = (uint)uVar7;
                uVar13 = uVar6 + 1;
                uVar12 = puVar2[(ulong)uVar6 * 2];
                uVar11 = puVar2[(ulong)uVar6 * 2 + 1];
                if (((uVar13 < uVar8) && (uVar12 == puVar2[(ulong)uVar13 * 2])) &&
                   (uVar11 == puVar2[(ulong)uVar13 * 2 + 1])) {
                  uVar13 = uVar6 + 2;
                  if (uVar13 < uVar8) {
                    puVar5 = puVar2 + (ulong)uVar13 * 2 + 1;
                    while ((uVar12 == puVar5[-1] && (uVar11 == *puVar5))) {
                      uVar13 = uVar13 + 1;
                      puVar5 = puVar5 + 2;
                      if (uVar8 == uVar13) goto LAB_004f8504;
                    }
                  }
                }
                else {
                  puVar2[uVar7 * 2] = uVar12;
                  puVar2[uVar7 * 2 + 1] = uVar11;
                  uVar7 = (ulong)(uVar14 + 1);
                }
                uVar14 = (uint)uVar7;
                uVar6 = uVar13;
              } while (uVar13 < uVar8);
            }
LAB_004f8504:
            if (ngon->m_Vcount <= uVar14) {
              ON_SortUnsignedIntArray(quick_sort,puVar2,(ulong)(uVar14 * 2));
              if (ngon->m_Vcount == 0) {
                return uVar14;
              }
              uVar4 = 0;
              while (puVar5 = ON_BinarySearchUnsignedIntArray
                                        (ngon->m_vi[uVar4],puVar2,(ulong)(uVar14 * 2)),
                    puVar5 != (uint *)0x0) {
                uVar4 = uVar4 + 1;
                if (ngon->m_Vcount <= uVar4) {
                  return uVar14;
                }
              }
              if (this != (ON_TextLog *)0x0) {
                pcVar9 = "ON_Mesh.Ngon(%u)->m_vi[%u] is not a boundary vertex.\n";
LAB_004f8326:
                ON_TextLog::Print(this,pcVar9,(ulong)ngon_index,uVar4 & 0xffffffff);
              }
              goto joined_r0x004f8332;
            }
            if (this == (ON_TextLog *)0x0) goto joined_r0x004f8332;
            pcVar9 = "ON_Mesh.Ngon(%u) has invalid face or vertex list.\n";
          }
        }
      }
LAB_004f82fb:
      ON_TextLog::Print(this,pcVar9,(ulong)ngon_index);
      goto joined_r0x004f8332;
    }
    if (this == (ON_TextLog *)0x0) goto joined_r0x004f8332;
    pcVar9 = "ON_Mesh.Ngon(%u)->m_Fcount < 1.\n";
  }
  ON_TextLog::Print(this,pcVar9,(ulong)ngon_index);
joined_r0x004f8332:
  if (((ulong)text_logx & 1) == 0) {
    ON_IsNotValid();
  }
  return 0;
}

Assistant:

unsigned int ON_MeshNgon::IsValid(
  const ON_MeshNgon* ngon,
  unsigned int ngon_index,
  ON_TextLog* text_logx,
  unsigned int mesh_vertex_count,
  unsigned int mesh_face_count,
  const ON_MeshFace* mesh_F,
  ON_SimpleArray< unsigned int >& workspace_buffer
  )
{
  workspace_buffer.SetCount(0);
  if ( nullptr == ngon )
    return true; // null ngons are ok

  const ON__INT_PTR lowbit = 1;
  const ON__INT_PTR hightbits = ~lowbit;
  bool bSilentError = ( 0 != (lowbit & ((ON__INT_PTR)text_logx)) );
  ON_TextLog* text_log = (ON_TextLog*)(((ON__INT_PTR)text_logx) & hightbits);

  if (ngon->m_Vcount < 3)
  {
    if ( text_log )
    {
      text_log->Print("ON_Mesh.Ngon(%u)->m_Vcount < 3.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  if (ngon->m_Fcount < 1)
  {
    if ( text_log )
    {
      text_log->Print("ON_Mesh.Ngon(%u)->m_Fcount < 1.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  if ( nullptr == ngon->m_vi )
  {
    if ( text_log )
    {
      text_log->Print("ON_Mesh.Ngon(%u)->m_vi is nullptr.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  if ( nullptr == ngon->m_fi )
  {
    if ( text_log )
    {
      text_log->Print("ON_Mesh.Ngon(%u)->m_fi is nullptr.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  for (unsigned int nvi = 0; nvi < ngon->m_Vcount; nvi++)
  {
    if (ngon->m_vi[nvi] >= mesh_vertex_count)
    {
      if ( text_log )
      {
        text_log->Print("ON_Mesh.Ngon(%u)->m_vi[%u] is invalid.\n",ngon_index,nvi);
      }
      return ON_MeshNgonIsNotValid(bSilentError);
    }
  }

  for (unsigned int nfi = 0; nfi < ngon->m_Fcount; nfi++)
  {
    unsigned int fi = ngon->m_fi[nfi];
    if (fi >= mesh_face_count)
    {
      if (text_log)
      {
        text_log->Print("ON_Mesh.Ngon(%u)->m_fi[%u] is invalid.\n", ngon_index, nfi);
      }
      return ON_MeshNgonIsNotValid(bSilentError);
    }
  }

  if (nullptr == mesh_F)
  {
    // mesh faces are required to check the boundary
    return true;
  }

  if (1 == ngon->m_Fcount && ngon->m_Vcount >= 3 && ngon->m_Vcount <= 4)
  {
    // fast test for a valid single face ngon
    unsigned int fi = ngon->m_fi[0];
    if (false == mesh_F[fi].IsValid(mesh_vertex_count))
    {
      if (text_log)
      {
        text_log->Print("ON_Mesh.Ngon(%u)->m_fi[0] is invalid.\n", ngon_index);
      }
      return ON_MeshNgonIsNotValid(bSilentError);
    }
    const unsigned int* fvi = (const unsigned int*)mesh_F[fi].vi;
    for (unsigned int nvi = 0; nvi < ngon->m_Vcount; nvi++)
    {
      if (fvi[0] == ngon->m_vi[nvi] && fvi[1] == ngon->m_vi[(nvi+1)%ngon->m_Vcount] && fvi[2] == ngon->m_vi[(nvi+2)%ngon->m_Vcount])
      {
        if (3 == ngon->m_Vcount && fvi[3] == fvi[2])
          return 3;
        if (4 == ngon->m_Vcount && fvi[3] == ngon->m_vi[(nvi+3)%ngon->m_Vcount])
          return 4;
      }
    }
    // boundary may be reversed
  }

  unsigned int* workspace = workspace_buffer.Reserve(8*ngon->m_Fcount);
  ON_2udex* edges = (ON_2udex*)workspace;
  unsigned int edge_count = 0;
  for (unsigned int nfi = 0; nfi < ngon->m_Fcount; nfi++)
  {
    unsigned int fi = ngon->m_fi[nfi];

    const unsigned int* fvi = (const unsigned int*)(mesh_F[fi].vi);
    unsigned int vi0;
    unsigned int vi1 = fvi[3];
    for (const unsigned int* fvi1 = fvi + 4; fvi < fvi1; fvi++)
    {
      vi0 = vi1;
      vi1 = *fvi;
      if (vi0 < vi1)
      {
        edges[edge_count].i = vi0;
        edges[edge_count++].j = vi1;
      }
      else if (vi0 > vi1)
      {
        edges[edge_count].i = vi1;
        edges[edge_count++].j = vi0;
      }
    }
  }

  if (edge_count < ngon->m_Vcount)
  {
    if (text_log)
    {
      text_log->Print("ON_Mesh.Ngon(%u) has invalid face or vertex list.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  ON_qsort(edges, edge_count, sizeof(edges[0]),compare2u);

  unsigned int bdry_edge_count = 0;
  for (unsigned int i = 0; i < edge_count; /*empty iterator*/)
  {
    const ON_2udex e0 = edges[i++];
    if (i < edge_count && e0.i == edges[i].i && e0.j == edges[i].j)
    {
      // not a boundary edge
      for (i++; i < edge_count; i++)
      {
        if (e0.i != edges[i].i || e0.j != edges[i].j)
          break;
      }
    }
    else
    {
      edges[bdry_edge_count++] = e0;
    }
  }

  if (bdry_edge_count < ngon->m_Vcount)
  {
    if (text_log)
    {
      text_log->Print("ON_Mesh.Ngon(%u) has invalid face or vertex list.\n",ngon_index);
    }
    return ON_MeshNgonIsNotValid(bSilentError);
  }

  ON_SortUnsignedIntArray( ON::sort_algorithm::quick_sort, workspace, 2*bdry_edge_count );

  for (unsigned int nvi = 0; nvi < ngon->m_Vcount; nvi++)
  {
    if ( nullptr == ON_BinarySearchUnsignedIntArray( ngon->m_vi[nvi], workspace, 2*bdry_edge_count) )
    {
      if ( text_log )
      {
        text_log->Print("ON_Mesh.Ngon(%u)->m_vi[%u] is not a boundary vertex.\n",ngon_index,nvi);
      }
      return ON_MeshNgonIsNotValid(bSilentError);
    }
  }

  // It is possible that the ngon is still not valid.
  //
  // If bdry_edge_count > ngon->m_Vcount, then there "could" be one or
  // more inner "holes" and the ngon->m_vi[] could reference a vertex
  // on an inner boundary.
  //
  // The vertices in ngon->m_v[] may not be a proper outer boundary.
  //
  // ...


  return bdry_edge_count;
}